

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O0

JavascriptString *
Js::DateImplementation::GetDateDefaultString
          (YMD *pymd,TZD *ptzd,DateTimeFlag noDateTime,ScriptContext *scriptContext)

{
  CompoundString *pCVar1;
  ScriptContext *scriptContext_local;
  TZD *ptzd_local;
  YMD *pymd_local;
  DateTimeFlag noDateTime_local;
  
  pCVar1 = GetDateDefaultString<Js::CompoundString,Js::ScriptContext,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0>
                     (pymd,ptzd,noDateTime,scriptContext,(anon_class_8_1_1b6df084)scriptContext);
  return (JavascriptString *)pCVar1;
}

Assistant:

JavascriptString*
    DateImplementation::GetDateDefaultString(DateTime::YMD *pymd, TZD *ptzd,DateTimeFlag noDateTime,ScriptContext* scriptContext)
    {
        return GetDateDefaultString<CompoundString>(pymd, ptzd, noDateTime, scriptContext,
            [=](CharCount capacity) -> CompoundString*
        {
            return CompoundString::NewWithCharCapacity(capacity, scriptContext->GetLibrary());
        });
    }